

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::MatchRange(GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *this,SizeType rangeIndex,uint codepoint)

{
  Range *pRVar1;
  bool bVar2;
  Range *r;
  SizeType SStack_1c;
  bool yes;
  uint codepoint_local;
  SizeType rangeIndex_local;
  GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_local;
  
  pRVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetRange
                     (this->regex_,rangeIndex);
  bVar2 = (pRVar1->start & 0x80000000) == 0;
  SStack_1c = rangeIndex;
  while( true ) {
    if (SStack_1c == 0xffffffff) {
      return !bVar2;
    }
    pRVar1 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetRange
                       (this->regex_,SStack_1c);
    if (((pRVar1->start & 0x7fffffff) <= codepoint) && (codepoint <= pRVar1->end)) break;
    SStack_1c = pRVar1->next;
  }
  return bVar2;
}

Assistant:

bool MatchRange(SizeType rangeIndex, unsigned codepoint) const {
        bool yes = (regex_.GetRange(rangeIndex).start & RegexType::kRangeNegationFlag) == 0;
        while (rangeIndex != kRegexInvalidRange) {
            const Range& r = regex_.GetRange(rangeIndex);
            if (codepoint >= (r.start & ~RegexType::kRangeNegationFlag) && codepoint <= r.end)
                return yes;
            rangeIndex = r.next;
        }
        return !yes;
    }